

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O2

void Gia_ManArePrintReport(Gia_ManAre_t *p,abctime Time,int fFinal)

{
  uint iState;
  uint uVar1;
  uint uVar2;
  abctime aVar3;
  char *format;
  int level;
  
  iState = p->iStaCur;
  uVar1 = p->nStas;
  uVar2 = Gia_ManAreDepth(p,iState);
  level = 0x84fbb2;
  printf("States =%10d. Reached =%10d. R = %5.3f. Depth =%6d. Mem =%9.2f MB.  ",
         (double)(int)iState / (double)(int)uVar1,
         ((double)p->nObjPages * 16.0 * 1048576.0 +
         (double)p->nSize * (double)p->nStaPages * 4.0 * 1048576.0 +
         (double)p->pAig->nRegs * 4.0 + 200.0 + 16384.0) * 9.5367431640625e-07,(ulong)iState,
         (ulong)uVar1,(ulong)uVar2);
  Abc_Print(level,"%s =","Time");
  aVar3 = Abc_Clock();
  format = "%9.2f sec\n";
  if (fFinal == 0) {
    format = "%9.2f sec\r";
  }
  Abc_Print(level,format,(double)(aVar3 - Time) / 1000000.0);
  return;
}

Assistant:

void Gia_ManArePrintReport( Gia_ManAre_t * p, abctime Time, int fFinal )
{
    printf( "States =%10d. Reached =%10d. R = %5.3f. Depth =%6d. Mem =%9.2f MB.  ", 
        p->iStaCur, p->nStas, 1.0*p->iStaCur/p->nStas, Gia_ManAreDepth(p, p->iStaCur), 
        (sizeof(Gia_ManAre_t) + 4.0*Gia_ManRegNum(p->pAig) + 8.0*MAX_PAGE_NUM + 
         4.0*p->nStaPages*p->nSize*MAX_ITEM_NUM + 16.0*p->nObjPages*MAX_ITEM_NUM)/(1<<20) );
    if ( fFinal )
    {
        ABC_PRT( "Time", Abc_Clock() - Time );
    }
    else
    {
        ABC_PRTr( "Time", Abc_Clock() - Time );
    }
}